

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCV.cpp
# Opt level: O0

void __thiscall TCV::handleChainCalls(TCV *this,string *nodeName,ASTNode *node)

{
  bool bVar1;
  ASTNode *node_local;
  string *nodeName_local;
  TCV *this_local;
  
  bVar1 = isCalledOnObject(node);
  if (bVar1) {
    checkIfClassFunctionCalledWithRightAccess(this,nodeName,node,false);
  }
  else {
    bVar1 = isCalledOnFunction(node);
    if (bVar1) {
      bVar1 = Variable::isTypeId(&this->returnType);
      if (bVar1) {
        checkIfClassFunctionCalledWithRightAccess(this,nodeName,node,true);
      }
    }
    else {
      checkIfFreeFunctionCalledWithRightArgument(this,nodeName,node);
    }
  }
  return;
}

Assistant:

void TCV::handleChainCalls(std::string &nodeName, AST::ASTNode *node) {
    if (isCalledOnObject(node)) {
        checkIfClassFunctionCalledWithRightAccess(nodeName, node);
    } else if (isCalledOnFunction(node)) {
        if (Variable::isTypeId(returnType))
            checkIfClassFunctionCalledWithRightAccess(nodeName, node, true);
    } else checkIfFreeFunctionCalledWithRightArgument(nodeName, node);
}